

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O2

ScriptOperator *
cfd::core::ScriptOperator::Get(ScriptOperator *__return_storage_ptr__,string *message)

{
  bool bVar1;
  __type _Var2;
  int __val;
  iterator iVar3;
  InvalidScriptException *this;
  string num_str;
  string search_text;
  string opcode_text;
  
  ::std::__cxx11::string::string((string *)&search_text,(string *)message);
  bVar1 = ::std::operator==(message,"OP_0");
  if ((bVar1) || (bVar1 = ::std::operator==(message,"OP_1NEGATE"), bVar1)) {
    ::std::__cxx11::string::assign((char *)&search_text);
  }
  else if (3 < message->_M_string_length) {
    ::std::__cxx11::string::substr((ulong)&num_str,(ulong)message);
    __val = atoi(num_str._M_dataplus._M_p);
    ::std::__cxx11::string::~string((string *)&num_str);
    ::std::__cxx11::to_string(&num_str,__val);
    ::std::operator+(&opcode_text,"OP_",&num_str);
    _Var2 = ::std::operator==(message,&opcode_text);
    if (__val - 1U < 0x10 && _Var2) {
      ::std::__cxx11::string::_M_assign((string *)&search_text);
    }
    ::std::__cxx11::string::~string((string *)&opcode_text);
    ::std::__cxx11::string::~string((string *)&num_str);
  }
  iVar3 = ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::ScriptOperator>_>_>
                  *)g_operator_text_map_abi_cxx11_,&search_text);
  if (iVar3._M_node == (_Base_ptr)(g_operator_text_map_abi_cxx11_ + 8)) {
    num_str._M_dataplus._M_p = "cfdcore_script.cpp";
    num_str._M_string_length._0_4_ = 0x1d3;
    num_str.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_3222be;
    logger::warn<>((CfdSourceLocation *)&num_str,"target op_code not found.");
    this = (InvalidScriptException *)__cxa_allocate_exception(0x30);
    ::std::__cxx11::string::string
              ((string *)&num_str,"target op_code not found.",(allocator *)&opcode_text);
    InvalidScriptException::InvalidScriptException(this,&num_str);
    __cxa_throw(this,&InvalidScriptException::typeinfo,CfdException::~CfdException);
  }
  ScriptOperator(__return_storage_ptr__,(ScriptOperator *)(iVar3._M_node + 2));
  ::std::__cxx11::string::~string((string *)&search_text);
  return __return_storage_ptr__;
}

Assistant:

ScriptOperator ScriptOperator::Get(const std::string& message) {
  std::string search_text = message;
  if (message == "OP_0") {
    search_text = "0";
  } else if (message == "OP_1NEGATE") {
    search_text = "-1";
  } else if (message.length() >= 4) {
    int num = std::atoi(message.substr(3).c_str());
    std::string num_str = std::to_string(num);
    std::string opcode_text = "OP_" + num_str;
    if ((message == opcode_text) && (num >= 1) && (num <= 16)) {
      search_text = num_str;
    }
  }
  decltype(g_operator_text_map)::const_iterator ite =
      g_operator_text_map.find(search_text);
  if (ite == g_operator_text_map.end()) {
    warn(CFD_LOG_SOURCE, "target op_code not found.");
    throw InvalidScriptException("target op_code not found.");
  }
  return ite->second;
}